

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_tag.cpp
# Opt level: O2

int32_t ultag_getVariantsSize(ULanguageTag *langtag)

{
  int iVar1;
  VariantListEntry **ppVVar2;
  
  ppVVar2 = &langtag->variants;
  iVar1 = 0;
  while( true ) {
    if (*ppVVar2 == (VariantListEntry *)0x0) break;
    iVar1 = iVar1 + 1;
    ppVVar2 = &(*ppVVar2)->next;
  }
  return iVar1;
}

Assistant:

static int32_t
ultag_getVariantsSize(const ULanguageTag* langtag) {
    int32_t size = 0;
    VariantListEntry *cur = langtag->variants;
    while (TRUE) {
        if (cur == NULL) {
            break;
        }
        size++;
        cur = cur->next;
    }
    return size;
}